

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_ast_trav_t * mpc_ast_traverse_start(mpc_ast_t *ast,mpc_ast_trav_order_t order)

{
  mpc_ast_trav_t *pmVar1;
  mpc_ast_trav_t *pmVar2;
  
  pmVar1 = (mpc_ast_trav_t *)malloc(0x18);
  pmVar1->curr_node = ast;
  pmVar1->parent = (mpc_ast_trav_t *)0x0;
  pmVar1->curr_child = 0;
  pmVar1->order = order;
  if (order == mpc_ast_trav_order_post) {
    while (0 < ast->children_num) {
      ast = *ast->children;
      pmVar2 = (mpc_ast_trav_t *)malloc(0x18);
      pmVar2->curr_node = ast;
      pmVar2->parent = pmVar1;
      pmVar2->curr_child = 0;
      pmVar2->order = mpc_ast_trav_order_post;
      pmVar1 = pmVar2;
    }
  }
  return pmVar1;
}

Assistant:

mpc_ast_trav_t *mpc_ast_traverse_start(mpc_ast_t *ast,
                                       mpc_ast_trav_order_t order)
{
  mpc_ast_trav_t *trav, *n_trav;
  mpc_ast_t *cnode = ast;

  /* Create the traversal structure */
  trav = malloc(sizeof(mpc_ast_trav_t));
  trav->curr_node = cnode;
  trav->parent = NULL;
  trav->curr_child = 0;
  trav->order = order;

  /* Get start node */
  switch(order) {
    case mpc_ast_trav_order_pre:
      /* Nothing else is needed for pre order start */
      break;

    case mpc_ast_trav_order_post:
      while(cnode->children_num > 0) {
        cnode = cnode->children[0];

        n_trav = malloc(sizeof(mpc_ast_trav_t));
        n_trav->curr_node = cnode;
        n_trav->parent = trav;
        n_trav->curr_child = 0;
        n_trav->order = order;

        trav = n_trav;
      }

      break;

    default:
      /* Unreachable, but compiler complaints */
      break;
  }

  return trav;
}